

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdconntable.c
# Opt level: O3

char * searchForStdBondingPartner(char *resname,char *atomname,int isAhydrogen)

{
  __int32_t *p_Var1;
  undefined1 uVar2;
  char cVar3;
  __int32_t **pp_Var4;
  char *pcVar5;
  char cVar6;
  char cVar7;
  bool bVar8;
  char querystring [10];
  undefined1 local_2a;
  undefined2 uStack_29;
  undefined1 local_27;
  undefined4 local_26;
  undefined1 local_22;
  
  if (atomname == (char *)0x0 || resname == (char *)0x0) {
    return (char *)0x0;
  }
  cVar3 = *resname;
  if ((long)cVar3 == 0) {
    _local_2a = 0x202020;
  }
  else {
    pp_Var4 = __ctype_toupper_loc();
    p_Var1 = *pp_Var4;
    if ((long)resname[1] == 0) {
      _local_2a = CONCAT21(0x2020,(char)p_Var1[cVar3]);
    }
    else {
      if ((long)resname[2] == 0) {
        uVar2 = 0x20;
      }
      else {
        uVar2 = (undefined1)p_Var1[resname[2]];
      }
      _local_2a = CONCAT12(uVar2,CONCAT11((char)p_Var1[resname[1]],(char)p_Var1[cVar3]));
    }
  }
  local_27 = 0x3a;
  cVar3 = *atomname;
  if ((long)cVar3 == 0) {
    local_26 = 0x20202020;
    cVar6 = ' ';
    bVar8 = false;
    cVar3 = ' ';
  }
  else {
    pp_Var4 = __ctype_toupper_loc();
    p_Var1 = *pp_Var4;
    cVar3 = (char)p_Var1[cVar3];
    if ((long)atomname[1] == 0) {
      local_26._0_3_ = CONCAT21(0x2020,cVar3);
      local_26 = CONCAT13(0x20,(undefined3)local_26);
      cVar6 = ' ';
    }
    else {
      cVar6 = (char)p_Var1[atomname[1]];
      local_26._0_2_ = CONCAT11(cVar6,cVar3);
      if ((long)atomname[2] != 0) {
        local_26._0_3_ = CONCAT12((char)p_Var1[atomname[2]],(undefined2)local_26);
        if ((long)atomname[3] == 0) {
          cVar7 = ' ';
        }
        else {
          cVar7 = (char)p_Var1[atomname[3]];
        }
        local_26 = CONCAT13(cVar7,(undefined3)local_26);
        bVar8 = cVar7 != ' ';
        goto LAB_00127287;
      }
      local_26 = CONCAT22(0x2020,(undefined2)local_26);
    }
    bVar8 = false;
  }
LAB_00127287:
  local_22 = 0;
  if (isAhydrogen != 0) {
    if ((bool)(cVar3 == 'D' & bVar8)) {
      local_26 = CONCAT31(local_26._1_3_,0x48);
    }
    else {
      cVar7 = 'H';
      if (cVar6 != 'D') {
        cVar7 = cVar6;
      }
      if (cVar3 == 'H') {
        cVar7 = cVar6;
      }
      local_26._0_2_ = CONCAT11(cVar7,(undefined1)local_26);
    }
  }
  pcVar5 = SearchStdResConnTable(&local_2a);
  if (pcVar5 == (char *)0x0) {
    local_27 = 0;
    pcVar5 = strstr(":GUA:GTP:GDP:GMP:GSP:ADE:ATP:ADP:AMP:CYT:CTP:CDP:CMP:URA:UTP:UDP:UMP:THY:TTP:TDP:TMP: DA: DT: DC: DG: AR: UR: TR: CR: GR:"
                    ,&local_2a);
    if (pcVar5 == (char *)0x0) {
      pcVar5 = (char *)0x0;
    }
    else {
      pcVar5 = strstr(":GUA:GTP:GDP:GMP:GSP: DG: GR:",&local_2a);
      if (pcVar5 == (char *)0x0) {
        pcVar5 = strstr(":ADE:ATP:ADP:AMP: DA: AR:",&local_2a);
        if (pcVar5 == (char *)0x0) {
          pcVar5 = strstr(":CYT:CTP:CDP:CMP: DC: CR:",&local_2a);
          if (pcVar5 == (char *)0x0) {
            pcVar5 = strstr(":URA:UTP:UDP:UMP: UR:",&local_2a);
            if (pcVar5 == (char *)0x0) {
              pcVar5 = strstr(":THY:TTP:TDP:TMP: DT: TR:",&local_2a);
              if (pcVar5 == (char *)0x0) {
                uStack_29._1_1_ = 0x20;
              }
              else {
                uStack_29._1_1_ = 0x54;
              }
            }
            else {
              uStack_29._1_1_ = 0x55;
            }
          }
          else {
            uStack_29._1_1_ = 0x43;
          }
        }
        else {
          uStack_29._1_1_ = 0x41;
        }
      }
      else {
        uStack_29._1_1_ = 0x47;
      }
      _local_2a = CONCAT12(uStack_29._1_1_,0x2020);
      local_27 = 0x3a;
      pcVar5 = SearchStdResConnTable(&local_2a);
    }
  }
  return pcVar5;
}

Assistant:

char * searchForStdBondingPartner(char *resname, char *atomname, int isAhydrogen) {
   char querystring[10], *p;

   /* a large part of this routine is devoted to converting residue names */
   /* and atom names into a search pattern. This pattern is 8 chars long  */
   /* and all uppercase. It has a colon as the forth character, separating*/
   /* residue name from atom name. Deuterum is converted to hydrogen.     */

   if (resname && atomname) {
      if (resname[0]) {
	 querystring[0] = toupper(resname[0]);
	 if (resname[1]) {
	    querystring[1] = toupper(resname[1]);
	    querystring[2] = resname[2] ? toupper(resname[2]) : ' ';
	 }
	 else { querystring[1] = querystring[2] = ' '; }
      }
      else { querystring[0] = querystring[1] = querystring[2] = ' '; }
      querystring[3] = ':';
      if (atomname[0]) {
	 querystring[4] = toupper(atomname[0]);
	 if (atomname[1]) {
	    querystring[5] = toupper(atomname[1]);
	    if (atomname[2]) {
	       querystring[6] = toupper(atomname[2]);
	       querystring[7] = atomname[3] ? toupper(atomname[3]) : ' ';
	    }
	    else { querystring[6] = querystring[7] = ' '; }
	 }
	 else { querystring[5] = querystring[6] = querystring[7] = ' '; }
      }
      else {
	 querystring[4] = querystring[5] = ' ';
	 querystring[6] = querystring[7] = ' ';
      }
      querystring[8] = '\0';

      if (isAhydrogen) {
	 /* because we know atomname is for a hydrogen atom we can */
	 /* make the following fixup for deuterium atoms           */
	 if ((querystring[4] == 'D') && (querystring[7] != ' ')) {
	    querystring[4] = 'H';
	 }
	 else if ((querystring[4] != 'H') && (querystring[5] == 'D')) {
	    querystring[5] = 'H';
	 }
      }

      p = SearchStdResConnTable(querystring);

      if (p == NULL) {
	 /* if failed because of a non-std nucleic acid residue name */
	 /* convert to "..X" and retry                               */

	 char *naALTlist = ":GUA:GTP:GDP:GMP:GSP:ADE:ATP:ADP:AMP:CYT:CTP:CDP:CMP:URA:UTP:UDP:UMP:THY:TTP:TDP:TMP: DA: DT: DC: DG: AR: UR: TR: CR: GR:";

	 querystring[3] = '\0'; /* temporarily look at just the first three chars */
	 if (strstr(naALTlist, querystring)) {
	    /* fixup common alternate nucleic acid residue names */
	         if(strstr(":GUA:GTP:GDP:GMP:GSP: DG: GR:", querystring)) {
	       querystring[2] = 'G';
	    }
	    else if(strstr(":ADE:ATP:ADP:AMP: DA: AR:",     querystring)) {
	       querystring[2] = 'A';
	    }
	    else if(strstr(":CYT:CTP:CDP:CMP: DC: CR:",     querystring)) {
	       querystring[2] = 'C';
	    }
	    else if(strstr(":URA:UTP:UDP:UMP: UR:",     querystring)) {
	       querystring[2] = 'U';
	    }
	    else if(strstr(":THY:TTP:TDP:TMP: DT: TR:",     querystring)) {
	       querystring[2] = 'T';
	    }
	    else { querystring[2] = ' '; }

	    querystring[0] = querystring[1] = ' '; /* i.e., blank-blank-[GACUT] */
				    /* put the string back together */
	    querystring[3] = ':';

	    p = SearchStdResConnTable(querystring); /* second time is a charm */
	 }
      }
   }
   else { p = NULL; }
   return p;
}